

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_WriteCountExpr_Test::TestBody(ExprWriterTest_WriteCountExpr_Test *this)

{
  vector<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  Impl *pIVar4;
  Impl *pIVar5;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *args;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_b0;
  string local_a8;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_78 [16];
  pointer local_68;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *local_60;
  size_t local_58;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> local_48;
  undefined1 local_40 [16];
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory.exprs_;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  pIVar4 = (Impl *)operator_new__(0x40);
  pIVar4->kind_ = FIRST_REFERENCE;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar4;
  pIVar4[1].kind_ = UNKNOWN;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  pIVar5 = (Impl *)operator_new__(0x80);
  pIVar5->kind_ = FIRST_EXPR;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar5;
  *(undefined8 *)(pIVar5 + 2) = 0;
  local_a8._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)this_00,(Impl **)&local_a8);
  local_48.super_ExprBase.impl_ = (ExprBase)operator_new__(0xc0);
  ((Impl *)local_48.super_ExprBase.impl_)->kind_ = EQ;
  (this->super_ExprWriterTest).super_ExprFactory.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_48.super_ExprBase.impl_;
  *(Impl **)((long)local_48.super_ExprBase.impl_ + 8) = pIVar4;
  *(Impl **)((long)local_48.super_ExprBase.impl_ + 0x10) = pIVar5;
  args = &local_48;
  uVar1 = (this->super_ExprWriterTest).l0;
  uVar2 = (this->super_ExprWriterTest).l1;
  local_40._8_4_ = (int)uVar1;
  local_40._0_8_ = uVar2;
  local_40._12_4_ = (int)((ulong)uVar1 >> 0x20);
  local_78 = (undefined1  [16])0x0;
  local_68 = (pointer)0x0;
  local_58 = 3;
  local_60 = args;
  local_b0.data_ =
       (AssertHelperData *)
       ExprWriterTest::MakeCount
                 (&this->super_ExprWriterTest,
                  (ArrayRef<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)local_78);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_a8,(fmt *)0x1674c5,(CStringRef)&local_b0,args);
  testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
            (local_88,"\"count(x1 = 0, 1, 0)\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeCount(args)))",
             (char (*) [20])"count(x1 = 0, 1, 0)",&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteCountExpr) {
  LogicalExpr args[] = {
    MakeRelational(ex::EQ, MakeVariable(0), MakeConst(0)), l1, l0
  };
  CHECK_WRITE("count(x1 = 0, 1, 0)", MakeCount(args));
}